

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTcSymFunc::gen_code_call
          (CTcSymFunc *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  CTcSymFunc *pCVar6;
  CTcSymFuncBase *this_00;
  size_t in_RCX;
  uint in_EDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  uint in_ESI;
  CTcSymFunc *in_RDI;
  undefined8 in_R8;
  char buf [128];
  CTcSymFunc *mmc;
  CTPNConst func;
  CTcConstVal funcval;
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  CTcGenTarg *in_stack_fffffffffffffed0;
  CTcDataStream *in_stack_fffffffffffffed8;
  CTcCodeStream *pCVar7;
  CTcSymFuncBase *in_stack_fffffffffffffee0;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  CTPNConst *in_stack_ffffffffffffff40;
  uchar in_stack_ffffffffffffffbf;
  undefined8 in_stack_ffffffffffffffc0;
  
  if ((char)(in_RDI->super_CTcSymFuncBase).field_0x80 < '\0') {
    cVar1 = (char)in_EDX;
    if (((byte)(in_RDI->super_CTcSymFuncBase).field_0x80 >> 5 & 1) == 0) {
      if ((int)in_RCX != 0) {
        CTcGenTarg::write_op((CTcGenTarg *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
      }
      CTcGenTarg::write_op((CTcGenTarg *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar1,__buf_02,in_RCX);
      iVar2 = CTcGenTarg::is_eval_for_dyn(G_cg);
      if (iVar2 == 0) {
        CTcSymFuncBase::add_abs_fixup(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        CTcDataStream::write4
                  ((CTcDataStream *)in_stack_fffffffffffffee0,(ulong)in_stack_fffffffffffffed8);
      }
      else {
        pCVar7 = G_cs;
        get_code_pool_addr((CTcSymFunc *)
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        CTcDataStream::write4((CTcDataStream *)in_stack_fffffffffffffee0,(ulong)pCVar7);
      }
      CTcGenTarg::note_pop(G_cg,in_EDX);
      CTcGenTarg::post_call_cleanup
                (in_stack_fffffffffffffed0,
                 (CTcNamedArgs *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      iVar2 = CTcSymFuncBase::argc_ok(&in_RDI->super_CTcSymFuncBase,in_EDX);
      if (iVar2 == 0) {
        sVar4 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x283189);
        uVar3 = (uint)sVar4;
        this_00 = (CTcSymFuncBase *)CTcSymbolBase::get_sym((CTcSymbolBase *)0x283197);
        pcVar5 = CTcSymFuncBase::get_argc_desc
                           (this_00,(char *)CONCAT44(uVar3,in_stack_fffffffffffffec8));
        CTcTokenizer::log_error(0x2d13,(ulong)uVar3,this_00,pcVar5,(ulong)in_EDX);
      }
      if (in_ESI == 0) {
        CTcGenTarg::write_op((CTcGenTarg *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
        CTcGenTarg::note_push((CTcGenTarg *)0x2831f8);
      }
    }
    else {
      if ((int)in_RCX == 0) {
        if ((int)in_EDX < 0x100) {
          CTcGenTarg::write_op((CTcGenTarg *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
          CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar1,__buf_00,in_RCX);
        }
        else {
          CTcGenTarg::write_op((CTcGenTarg *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
          CTcDataStream::write2
                    ((CTcDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        }
      }
      else {
        CTcGenTarg::write_op((CTcGenTarg *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar1,__buf,in_RCX);
      }
      pCVar7 = G_cs;
      iVar2 = CTcGenTarg::get_predef_meta_idx(G_cg,1);
      CTcDataStream::write(&pCVar7->super_CTcDataStream,(int)(char)iVar2,__buf_01,in_RCX);
      CTcGenTarg::note_pop(G_cg,in_EDX);
      CTcGenTarg::write_op((CTcGenTarg *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
      CTcGenTarg::note_push((CTcGenTarg *)0x282ff0);
      CTcConstVal::CTcConstVal((CTcConstVal *)&stack0xffffffffffffffb8);
      CTcConstVal::set_funcptr((CTcConstVal *)&stack0xffffffffffffffb8,in_RDI);
      CTPNConst::CTPNConst
                ((CTPNConst *)in_stack_fffffffffffffed0,
                 (CTcConstVal *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      CTPNConst::gen_code(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                          in_stack_ffffffffffffff38);
      pCVar6 = get_internal_func(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                                 in_stack_ffffffffffffff20);
      if (pCVar6 != (CTcSymFunc *)0x0) {
        (*(pCVar6->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
          super_CVmHashEntry._vptr_CVmHashEntry[0x1b])(pCVar6,(ulong)in_ESI,2,0,in_R8);
      }
    }
  }
  else {
    sVar4 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x282ea4);
    pcVar5 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x282eb2);
    CTcTokenizer::log_error(0x2d2e,sVar4 & 0xffffffff,pcVar5);
  }
  return;
}

Assistant:

void CTcSymFunc::gen_code_call(int discard, int argc, int varargs,
                               CTcNamedArgs *named_args)
{
    /* we can't call a function that doesn't have a prototype */
    if (!has_proto_)
    {
        G_tok->log_error(TCERR_FUNC_CALL_NO_PROTO,
                         (int)get_sym_len(), get_sym());
        return;
    }

    /*
     *   If this is a multi-method base function, a call to the function is
     *   actually a call to _multiMethodCall('name', args).  
     */
    if (is_multimethod_base_)
    {
        /* make a list out of the arguments */
        if (varargs)
        {
            G_cg->write_op(OPC_VARARGC);
            G_cs->write((char)argc);
        }
        else if (argc <= 255)
        {
            G_cg->write_op(OPC_NEW1);
            G_cs->write((char)argc);
        }
        else
        {
            G_cg->write_op(OPC_NEW2);
            G_cs->write2(argc);
        }
        G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
        G_cg->note_pop(argc);

        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();

        /* add the base function pointer argument */
        CTcConstVal funcval;
        funcval.set_funcptr(this);
        CTPNConst func(&funcval);
        func.gen_code(FALSE, FALSE);

        /* look up _multiMethodCall */
        CTcSymFunc *mmc = get_internal_func(
            "_multiMethodCall", 1, 0, TRUE, TRUE);

        /* 
         *   Generate the call.  Note that there are always two arguments at
         *   this point: the base function pointer, and the argument list.
         *   The argument list is just one argument because we've already
         *   constructed a list out of it.  
         */
        if (mmc != 0)
            mmc->gen_code_call(discard, 2, FALSE, named_args);
    }
    else
    {
        /* write the varargs modifier if appropriate */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);

        /* generate the call instruction and argument count */
        G_cg->write_op(OPC_CALL);
        G_cs->write((char)argc);

        /* check the mode */
        if (G_cg->is_eval_for_dyn())
        {
            /* 
             *   dynamic (run-time) compilation - we know the absolute
             *   address already, since all symbols are pre-resolved in the
             *   debugger 
             */
            G_cs->write4(get_code_pool_addr());
        }
        else
        {
            /* 
             *   Normal compilation - we won't know the function's address
             *   until after generation is completed, so add a fixup for the
             *   current location, then write a placeholder for the offset
             *   field.  
             */
            add_abs_fixup(G_cs);
            G_cs->write4(0);
        }

        /* call removes arguments */
        G_cg->note_pop(argc);

        /* do post-call cleanup: named arg removal, etc */
        G_cg->post_call_cleanup(named_args);

        /* make sure the argument count is correct */
        if (!argc_ok(argc))
        {
            char buf[128];
            G_tok->log_error(TCERR_WRONG_ARGC_FOR_FUNC,
                             (int)get_sym_len(), get_sym(),
                             get_argc_desc(buf), argc);
        }

        /* if we're not discarding, push the return value from R0 */
        if (!discard)
        {
            G_cg->write_op(OPC_GETR0);
            G_cg->note_push();
        }
    }
}